

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QRegion __thiscall QWidgetPrivate::clipRegion(QWidgetPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  QWidgetData *pQVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  long lVar7;
  int iVar8;
  Representation RVar9;
  long in_RSI;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  QWidget *pQVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QRegion local_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)(in_RSI + 8);
  if ((this_00->data->widget_attributes & 0x8000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_002f379b:
      __stack_chk_fail();
    }
    QRegion::QRegion((QRegion *)this);
  }
  else {
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    _local_48 = QWidget::rect(this_00);
    iVar10 = 0;
    QRegion::QRegion((QRegion *)this,(QRect *)local_48,Rectangle);
    iVar8 = 0;
    pQVar13 = this_00;
    while ((((pQVar13->data->widget_attributes & 0x8000) != 0 &&
            (((pQVar13->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
           (*(long *)(*(long *)&pQVar13->field_0x8 + 0x10) != 0))) {
      iVar4 = QWidget::x(pQVar13);
      iVar10 = iVar10 - iVar4;
      iVar4 = QWidget::y(pQVar13);
      iVar8 = iVar8 - iVar4;
      pQVar2 = *(QWidget **)(*(long *)&pQVar13->field_0x8 + 0x10);
      pQVar3 = pQVar2->data;
      QRegion::QRegion((QRegion *)local_48,iVar10,iVar8,
                       ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1,
                       ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1,Rectangle);
      QRegion::operator&=((QRegion *)this,(QRegion *)local_48);
      QRegion::~QRegion((QRegion *)local_48);
      lVar7 = *(long *)&pQVar2->field_0x8;
      uVar11 = 0;
      do {
        uVar12 = uVar11 + 1;
        lVar1 = uVar11 * 8;
        uVar11 = uVar12;
      } while (*(QWidget **)(*(long *)(lVar7 + 0x20) + lVar1) != pQVar13);
      for (; pQVar13 = pQVar2, uVar12 < *(ulong *)(lVar7 + 0x28); uVar12 = uVar12 + 1) {
        pQVar13 = *(QWidget **)(*(long *)(lVar7 + 0x20) + uVar12 * 8);
        if (((pQVar13 != (QWidget *)0x0) &&
            ((*(byte *)(*(long *)&pQVar13->field_0x8 + 0x30) & 1) != 0)) &&
           (((pQVar13->data->widget_attributes & 0x8000) != 0 &&
            (((pQVar13->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)))) {
          stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
          local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          iVar4 = QWidget::x(pQVar13);
          iVar5 = QWidget::y(pQVar13);
          pQVar3 = pQVar13->data;
          local_48._4_4_ = iVar5 + iVar8;
          local_48._0_4_ = iVar4 + iVar10;
          local_48._8_4_ = ((pQVar3->crect).x2.m_i + iVar4 + iVar10) - (pQVar3->crect).x1.m_i;
          RStack_3c.m_i = ((pQVar3->crect).y2.m_i + iVar5 + iVar8) - (pQVar3->crect).y1.m_i;
          QVar14 = QWidget::rect(this_00);
          RVar6.m_i = local_48._0_4_;
          if ((int)local_48._0_4_ <= QVar14.x1.m_i.m_i) {
            RVar6.m_i = QVar14.x1.m_i.m_i;
          }
          RVar9.m_i = local_48._8_4_;
          if (QVar14.x2.m_i.m_i <= (int)local_48._8_4_) {
            RVar9.m_i = QVar14.x2.m_i.m_i;
          }
          if (RVar6.m_i <= RVar9.m_i) {
            RVar6.m_i = QVar14.y1.m_i.m_i;
            if (QVar14.y1.m_i.m_i < (int)local_48._4_4_) {
              RVar6.m_i = local_48._4_4_;
            }
            RVar9.m_i = QVar14.y2.m_i.m_i;
            if (RStack_3c.m_i < QVar14.y2.m_i.m_i) {
              RVar9.m_i = RStack_3c.m_i;
            }
            if (RVar6.m_i <= RVar9.m_i) {
              QRegion::QRegion(&local_50,(QRect *)local_48,Rectangle);
              QRegion::operator-=((QRegion *)this,&local_50);
              QRegion::~QRegion(&local_50);
            }
          }
          lVar7 = *(long *)&pQVar2->field_0x8;
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002f379b;
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QWidgetPrivate::clipRegion() const
{
    Q_Q(const QWidget);
    if (!q->isVisible())
        return QRegion();
    QRegion r(q->rect());
    const QWidget * w = q;
    const QWidget *ignoreUpTo;
    int ox = 0;
    int oy = 0;
    while (w
           && w->isVisible()
           && !w->isWindow()
           && w->parentWidget()) {
        ox -= w->x();
        oy -= w->y();
        ignoreUpTo = w;
        w = w->parentWidget();
        r &= QRegion(ox, oy, w->width(), w->height());

        int i = 0;
        while(w->d_func()->children.at(i++) != static_cast<const QObject *>(ignoreUpTo))
            ;
        for ( ; i < w->d_func()->children.size(); ++i) {
            if (QWidget *sibling = qobject_cast<QWidget *>(w->d_func()->children.at(i))) {
                if (sibling->isVisible() && !sibling->isWindow()) {
                    QRect siblingRect(ox+sibling->x(), oy+sibling->y(),
                                      sibling->width(), sibling->height());
                    if (qRectIntersects(siblingRect, q->rect()))
                        r -= QRegion(siblingRect);
                }
            }
        }
    }
    return r;
}